

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

void __thiscall CStorage::CStorage(CStorage *this)

{
  IStorage *in_RDI;
  uint in_stack_ffffffffffffffdc;
  
  IStorage::IStorage(in_RDI);
  (in_RDI->super_IInterface)._vptr_IInterface = (_func_int **)&PTR__CStorage_0029abd0;
  mem_zero(in_RDI,in_stack_ffffffffffffffdc);
  *(undefined4 *)&in_RDI[0x201].super_IInterface._vptr_IInterface = 0;
  *(undefined1 *)((long)&in_RDI[0x201].super_IInterface._vptr_IInterface + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0x221].super_IInterface._vptr_IInterface + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0x241].super_IInterface._vptr_IInterface + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0x261].super_IInterface._vptr_IInterface + 4) = 0;
  return;
}

Assistant:

CStorage()
	{
		mem_zero(m_aaStoragePaths, sizeof(m_aaStoragePaths));
		m_NumPaths = 0;
		m_aDataDir[0] = 0;
		m_aUserDir[0] = 0;
		m_aCurrentDir[0] = 0;
		m_aAppDir[0] = 0;
	}